

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O1

int __thiscall Cleaner::CleanAll(Cleaner *this,bool generator)

{
  bool bVar1;
  Edge *pEVar2;
  pointer ppNVar3;
  pointer ppEVar4;
  string local_50;
  
  this->status_ = 0;
  this->cleaned_files_count_ = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->removed_)._M_t);
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::clear(&(this->cleaned_)._M_t);
  PrintHeader(this);
  LoadDyndeps(this);
  ppEVar4 = (this->state_->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar4 !=
      (this->state_->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      bVar1 = Edge::is_phony(*ppEVar4);
      if (!bVar1) {
        if (generator) {
          bVar1 = false;
        }
        else {
          pEVar2 = *ppEVar4;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"generator","");
          bVar1 = Edge::GetBindingBool(pEVar2,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar1 == false) {
          pEVar2 = *ppEVar4;
          for (ppNVar3 = (pEVar2->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              ppNVar3 !=
              (pEVar2->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppNVar3 = ppNVar3 + 1) {
            Remove(this,&(*ppNVar3)->path_);
            pEVar2 = *ppEVar4;
          }
          RemoveEdgeFiles(this,pEVar2);
        }
      }
      ppEVar4 = ppEVar4 + 1;
    } while (ppEVar4 !=
             (this->state_->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (*(int *)this->config_ != 1) {
    printf("%d files.\n",(ulong)(uint)this->cleaned_files_count_);
  }
  return this->status_;
}

Assistant:

int Cleaner::CleanAll(bool generator) {
  Reset();
  PrintHeader();
  LoadDyndeps();
  for (vector<Edge*>::iterator e = state_->edges_.begin();
       e != state_->edges_.end(); ++e) {
    // Do not try to remove phony targets
    if ((*e)->is_phony())
      continue;
    // Do not remove generator's files unless generator specified.
    if (!generator && (*e)->GetBindingBool("generator"))
      continue;
    for (vector<Node*>::iterator out_node = (*e)->outputs_.begin();
         out_node != (*e)->outputs_.end(); ++out_node) {
      Remove((*out_node)->path());
    }

    RemoveEdgeFiles(*e);
  }
  PrintFooter();
  return status_;
}